

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O1

vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> * __thiscall
chaiscript::dispatch::Bound_Function::build_param_list
          (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
           *__return_storage_ptr__,Bound_Function *this,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params)

{
  bool bVar1;
  pointer __x;
  pointer __x_00;
  Type_Info local_48;
  
  __x = (params->
        super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>).
        _M_impl.super__Vector_impl_data._M_start;
  __x_00 = (this->m_args).
           super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((__x != (params->
              super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>)
              ._M_impl.super__Vector_impl_data._M_finish) ||
     (__x_00 != (this->m_args).
                super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                ._M_impl.super__Vector_impl_data._M_finish)) {
LAB_00220b7e:
    do {
      if (__x_00 != (this->m_args).
                    super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        local_48.m_type_info = (type_info *)&Placeholder_Object::typeinfo;
        local_48.m_bare_type_info = (type_info *)&Placeholder_Object::typeinfo;
        local_48.m_flags = 0;
        bVar1 = Type_Info::operator==
                          (&((__x_00->m_data).
                             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->m_type_info,&local_48);
        if (!bVar1) {
          std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::push_back
                    (__return_storage_ptr__,__x_00);
          __x_00 = __x_00 + 1;
          goto LAB_00220b7e;
        }
      }
      if (__x != (params->
                 super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                 )._M_impl.super__Vector_impl_data._M_finish) {
        std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::push_back
                  (__return_storage_ptr__,__x);
        __x = __x + 1;
      }
      if (__x_00 != (this->m_args).
                    super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        local_48.m_type_info = (type_info *)&Placeholder_Object::typeinfo;
        local_48.m_bare_type_info = (type_info *)&Placeholder_Object::typeinfo;
        local_48.m_flags = 0;
        bVar1 = Type_Info::operator==
                          (&((__x_00->m_data).
                             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->m_type_info,&local_48);
        __x_00 = __x_00 + bVar1;
      }
    } while ((__x != (params->
                     super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                     )._M_impl.super__Vector_impl_data._M_finish) ||
            (__x_00 != (this->m_args).
                       super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                       ._M_impl.super__Vector_impl_data._M_finish));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Boxed_Value> build_param_list(const std::vector<Boxed_Value> &params) const
        {
          auto parg = params.begin();
          auto barg = m_args.begin();

          std::vector<Boxed_Value> args;

          while (!(parg == params.end() && barg == m_args.end()))
          {
            while (barg != m_args.end() 
                && !(barg->get_type_info() == chaiscript::detail::Get_Type_Info<Placeholder_Object>::get()))
            {
              args.push_back(*barg);
              ++barg;
            }

            if (parg != params.end())
            {
              args.push_back(*parg);
              ++parg;
            }

            if (barg != m_args.end() 
                && barg->get_type_info() == chaiscript::detail::Get_Type_Info<Placeholder_Object>::get())
            {
              ++barg;
            } 
          }
          return args;
        }